

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fsync_cb(uv_fs_t *req)

{
  int iVar1;
  int r;
  uv_fs_t *req_local;
  
  if (req != &fsync_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1cb,"req == &fsync_req");
    abort();
  }
  if (fsync_req.fs_type != UV_FS_FSYNC) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1cc,"req->fs_type == UV_FS_FSYNC");
    abort();
  }
  if (fsync_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1cd,"req->result == 0");
    abort();
  }
  fsync_cb_count = fsync_cb_count + 1;
  uv_fs_req_cleanup(&fsync_req);
  iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1d1,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void fsync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fsync_req);
  ASSERT(req->fs_type == UV_FS_FSYNC);
  ASSERT(req->result == 0);
  fsync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}